

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

int __thiscall Func::GetForInEnumeratorArrayOffset(Func *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  Func *pFVar5;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar6;
  Func *topFunc;
  Func *this_local;
  
  pFVar5 = GetTopFunc(this);
  uVar1 = this->m_forInLoopBaseDepth;
  this_00 = GetJITFunctionBody(this);
  uVar4 = JITTimeFunctionBody::GetForInLoopDepth(this_00);
  if (pFVar5->m_forInLoopMaxDepth < uVar1 + uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x826,
                       "(this->m_forInLoopBaseDepth + this->GetJITFunctionBody()->GetForInLoopDepth() <= topFunc->m_forInLoopMaxDepth)"
                       ,
                       "this->m_forInLoopBaseDepth + this->GetJITFunctionBody()->GetForInLoopDepth() <= topFunc->m_forInLoopMaxDepth"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return pFVar5->m_forInEnumeratorArrayOffset + this->m_forInLoopBaseDepth * 0x58;
}

Assistant:

int
Func::GetForInEnumeratorArrayOffset() const
{
    Func const* topFunc = this->GetTopFunc();
    Assert(this->m_forInLoopBaseDepth + this->GetJITFunctionBody()->GetForInLoopDepth() <= topFunc->m_forInLoopMaxDepth);
    return topFunc->m_forInEnumeratorArrayOffset
        + this->m_forInLoopBaseDepth * sizeof(Js::ForInObjectEnumerator);
}